

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O2

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::SetRawIssueAsset
          (ConfidentialTransactionController *__return_storage_ptr__,ElementsTransactionApi *this,
          string *tx_hex,
          vector<cfd::api::TxInIssuanceParameters,_std::allocator<cfd::api::TxInIssuanceParameters>_>
          *issuances,
          vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>
          *issuance_output)

{
  Txid *pTVar1;
  Txid *txid;
  ByteData token_nonce;
  ByteData asset_nonce;
  Script asset_locking_script;
  IssuanceParameter issuance_param;
  IssuanceOutput output;
  Script token_locking_script;
  
  ConfidentialTransactionController::ConfidentialTransactionController
            (__return_storage_ptr__,tx_hex);
  pTVar1 = *(Txid **)(issuances + 8);
  for (txid = *(Txid **)issuances; txid != pTVar1;
      txid = (Txid *)&txid[0x12].data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
    core::AbstractTxOut::GetLockingScript
              (&asset_locking_script,
               (AbstractTxOut *)
               &txid[1].data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    core::ConfidentialNonce::ConfidentialNonce
              ((ConfidentialNonce *)&output,
               (ConfidentialNonce *)
               &txid[6].data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    core::ConfidentialNonce::GetData(&asset_nonce,(ConfidentialNonce *)&output);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&output);
    core::AbstractTxOut::GetLockingScript(&token_locking_script,(AbstractTxOut *)(txid + 10));
    core::ConfidentialNonce::ConfidentialNonce
              ((ConfidentialNonce *)&output,(ConfidentialNonce *)(txid + 0xf));
    core::ConfidentialNonce::GetData(&token_nonce,(ConfidentialNonce *)&output);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&output);
    ConfidentialTransactionController::SetAssetIssuance
              (&issuance_param,__return_storage_ptr__,txid,*(uint32_t *)&txid[1]._vptr_Txid,
               (Amount *)&txid[1].data_,&asset_locking_script,&asset_nonce,
               (Amount *)
               &txid[9].data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish,&token_locking_script,&token_nonce,
               *(bool *)&txid[0x12].data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish,
               (ByteData256 *)
               &txid[0x11].data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,false,false);
    if (issuance_output !=
        (vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> *)0x0) {
      IssuanceOutput::IssuanceOutput(&output);
      core::Txid::operator=(&output.txid,txid);
      output.vout = *(uint32_t *)&txid[1]._vptr_Txid;
      core::ConfidentialAssetId::operator=(&output.output.asset,&issuance_param.asset);
      core::BlindFactor::operator=(&output.output.entropy,&issuance_param.entropy);
      core::ConfidentialAssetId::operator=(&output.output.token,&issuance_param.token);
      std::vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>::push_back
                (issuance_output,&output);
      IssuanceOutput::~IssuanceOutput(&output);
    }
    core::IssuanceParameter::~IssuanceParameter(&issuance_param);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&token_nonce);
    core::Script::~Script(&token_locking_script);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&asset_nonce);
    core::Script::~Script(&asset_locking_script);
  }
  return __return_storage_ptr__;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::SetRawIssueAsset(
    const std::string& tx_hex,
    const std::vector<TxInIssuanceParameters>& issuances,
    std::vector<IssuanceOutput>* issuance_output) {
  ConfidentialTransactionController ctxc(tx_hex);

  for (const auto& issuance : issuances) {
    Script asset_locking_script = issuance.asset_txout.GetLockingScript();
    ByteData asset_nonce = issuance.asset_txout.GetNonce().GetData();
    Script token_locking_script = issuance.token_txout.GetLockingScript();
    ByteData token_nonce = issuance.token_txout.GetNonce().GetData();

    IssuanceParameter issuance_param = ctxc.SetAssetIssuance(
        issuance.txid, issuance.vout, issuance.asset_amount,
        asset_locking_script, asset_nonce, issuance.token_amount,
        token_locking_script, token_nonce, issuance.is_blind,
        issuance.contract_hash, false);

    if (issuance_output != nullptr) {
      IssuanceOutput output;
      output.txid = issuance.txid;
      output.vout = issuance.vout;
      output.output.asset = issuance_param.asset;
      output.output.entropy = issuance_param.entropy;
      output.output.token = issuance_param.token;
      issuance_output->push_back(output);
    }
  }
  return ctxc;
}